

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O3

void __thiscall soplex::NameSet::~NameSet(NameSet *this)

{
  pointer pEVar1;
  
  free(this->mem);
  this->mem = (char *)0x0;
  pEVar1 = (this->hashtab).m_elem.data.
           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1,(long)(this->hashtab).m_elem.data.
                                 super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar1);
  }
  DataSet<int>::~DataSet(&this->set);
  return;
}

Assistant:

NameSet::~NameSet()
{
   spx_free(mem);
}